

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushStyleColor(ImGuiCol idx,ImVec4 *col)

{
  ImGuiColorMod *__src;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  ImGuiColorMod *__dest;
  ImVec4 *pIVar7;
  int iVar8;
  int iVar9;
  
  pIVar5 = GImGui;
  pIVar7 = (GImGui->Style).Colors + idx;
  fVar1 = pIVar7->x;
  fVar2 = pIVar7->y;
  fVar3 = pIVar7->z;
  fVar4 = pIVar7->w;
  iVar6 = (GImGui->ColorStack).Size;
  if (iVar6 == (GImGui->ColorStack).Capacity) {
    if (iVar6 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar6 / 2 + iVar6;
    }
    iVar9 = iVar6 + 1;
    if (iVar6 + 1 < iVar8) {
      iVar9 = iVar8;
    }
    __dest = (ImGuiColorMod *)MemAlloc((long)iVar9 * 0x14);
    __src = (pIVar5->ColorStack).Data;
    if (__src != (ImGuiColorMod *)0x0) {
      memcpy(__dest,__src,(long)(pIVar5->ColorStack).Size * 0x14);
      MemFree((pIVar5->ColorStack).Data);
    }
    (pIVar5->ColorStack).Data = __dest;
    (pIVar5->ColorStack).Capacity = iVar9;
    iVar6 = (pIVar5->ColorStack).Size;
  }
  else {
    __dest = (GImGui->ColorStack).Data;
  }
  __dest[iVar6].Col = idx;
  pIVar7 = &__dest[iVar6].BackupValue;
  pIVar7->x = fVar1;
  pIVar7->y = fVar2;
  pIVar7->z = fVar3;
  pIVar7->w = fVar4;
  (pIVar5->ColorStack).Size = (pIVar5->ColorStack).Size + 1;
  if (pIVar5->DebugFlashStyleColorIdx != idx) {
    pIVar7 = (pIVar5->Style).Colors + idx;
    fVar1 = col->y;
    fVar2 = col->z;
    fVar3 = col->w;
    pIVar7->x = col->x;
    pIVar7->y = fVar1;
    pIVar7 = (pIVar5->Style).Colors + idx;
    pIVar7->z = fVar2;
    pIVar7->w = fVar3;
  }
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, const ImVec4& col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorStack.push_back(backup);
    if (g.DebugFlashStyleColorIdx != idx)
        g.Style.Colors[idx] = col;
}